

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

GLogColor google::SeverityToColor(LogSeverity severity)

{
  bool local_11;
  GLogColor local_10;
  GLogColor color;
  LogSeverity severity_local;
  
  local_11 = 3 < (uint)severity;
  if (local_11) {
    __assert_fail("severity >= 0 && severity < NUM_SEVERITIES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                  ,0x117,"GLogColor google::SeverityToColor(LogSeverity)");
  }
  if (severity == 0) {
    local_10 = COLOR_DEFAULT;
  }
  else if (severity == 1) {
    local_10 = COLOR_YELLOW;
  }
  else {
    if (1 < severity - 2U) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                    ,0x126,"GLogColor google::SeverityToColor(LogSeverity)");
    }
    local_10 = COLOR_RED;
  }
  return local_10;
}

Assistant:

static GLogColor SeverityToColor(LogSeverity severity) {
  assert(severity >= 0 && severity < NUM_SEVERITIES);
  GLogColor color = COLOR_DEFAULT;
  switch (severity) {
  case GLOG_INFO:
    color = COLOR_DEFAULT;
    break;
  case GLOG_WARNING:
    color = COLOR_YELLOW;
    break;
  case GLOG_ERROR:
  case GLOG_FATAL:
    color = COLOR_RED;
    break;
  default:
    // should never get here.
    assert(false);
  }
  return color;
}